

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

void Sim_UtilSimulateNodeOne(Abc_Obj_t *pNode,Vec_Ptr_t *vSimInfo,int nSimWords,int nOffset)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    pvVar3 = Vec_PtrEntry(vSimInfo,pNode->Id);
    pvVar4 = Vec_PtrEntry(vSimInfo,*(pNode->vFanins).pArray);
    pvVar5 = Vec_PtrEntry(vSimInfo,(pNode->vFanins).pArray[1]);
    lVar6 = (long)nOffset;
    uVar1 = *(uint *)&pNode->field_0x14;
    if ((uVar1 >> 0xb & 1) == 0 || (uVar1 >> 10 & 1) == 0) {
      if ((uVar1 >> 10 & 1) == 0 || (uVar1 >> 0xb & 1) != 0) {
        uVar2 = 0;
        if (0 < nSimWords) {
          uVar2 = nSimWords;
        }
        if (((byte)(uVar1 >> 0xb) & (uVar1 >> 10 & 1) == 0) == 0) {
          for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
            *(uint *)((long)pvVar3 + uVar8 * 4 + lVar6 * 4) =
                 *(uint *)((long)pvVar5 + uVar8 * 4 + lVar6 * 4) &
                 *(uint *)((long)pvVar4 + uVar8 * 4 + lVar6 * 4);
          }
        }
        else {
          for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
            *(uint *)((long)pvVar3 + uVar8 * 4 + lVar6 * 4) =
                 ~*(uint *)((long)pvVar5 + uVar8 * 4 + lVar6 * 4) &
                 *(uint *)((long)pvVar4 + uVar8 * 4 + lVar6 * 4);
          }
        }
      }
      else {
        uVar7 = 0;
        uVar8 = (ulong)(uint)nSimWords;
        if (nSimWords < 1) {
          uVar8 = uVar7;
        }
        for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          *(uint *)((long)pvVar3 + uVar7 * 4 + lVar6 * 4) =
               ~*(uint *)((long)pvVar4 + uVar7 * 4 + lVar6 * 4) &
               *(uint *)((long)pvVar5 + uVar7 * 4 + lVar6 * 4);
        }
      }
    }
    else {
      uVar7 = 0;
      uVar8 = (ulong)(uint)nSimWords;
      if (nSimWords < 1) {
        uVar8 = uVar7;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        *(uint *)((long)pvVar3 + uVar7 * 4 + lVar6 * 4) =
             ~(*(uint *)((long)pvVar5 + uVar7 * 4 + lVar6 * 4) |
              *(uint *)((long)pvVar4 + uVar7 * 4 + lVar6 * 4));
      }
    }
    return;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simUtils.c"
                ,0x133,"void Sim_UtilSimulateNodeOne(Abc_Obj_t *, Vec_Ptr_t *, int, int)");
}

Assistant:

void Sim_UtilSimulateNodeOne( Abc_Obj_t * pNode, Vec_Ptr_t * vSimInfo, int nSimWords, int nOffset )
{
    unsigned * pSimmNode, * pSimmNode1, * pSimmNode2;
    int k, fComp1, fComp2;
    // simulate the internal nodes
    assert( Abc_ObjIsNode(pNode) );
    pSimmNode  = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
    pSimmNode1 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId0(pNode));
    pSimmNode2 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId1(pNode));
    pSimmNode  += nOffset;
    pSimmNode1 += nOffset;
    pSimmNode2 += nOffset;
    fComp1 = Abc_ObjFaninC0(pNode);
    fComp2 = Abc_ObjFaninC1(pNode);
    if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] = ~pSimmNode1[k] & ~pSimmNode2[k];
    else if ( fComp1 && !fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] = ~pSimmNode1[k] &  pSimmNode2[k];
    else if ( !fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] =  pSimmNode1[k] & ~pSimmNode2[k];
    else // if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] =  pSimmNode1[k] &  pSimmNode2[k];
}